

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h1-proxy.c
# Opt level: O0

CURLcode cf_h1_proxy_connect(Curl_cfilter *cf,Curl_easy *data,_Bool *done)

{
  CURLcode CVar1;
  _Bool local_39;
  h1_tunnel_state_conflict *local_38;
  h1_tunnel_state_conflict *ts;
  _Bool *p_Stack_28;
  CURLcode result;
  _Bool *done_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  local_38 = (h1_tunnel_state_conflict *)cf->ctx;
  if ((cf->field_0x24 & 1) == 0) {
    p_Stack_28 = done;
    done_local = (_Bool *)data;
    data_local = (Curl_easy *)cf;
    if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x89c >> 0x1e & 1) != 0)) &&
        (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
       ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
      Curl_trc_cf_infof(data,cf,"connect");
    }
    ts._4_4_ = (**(code **)(*(long *)data_local->id + 0x18))(data_local->id,done_local,p_Stack_28);
    cf_local._4_4_ = ts._4_4_;
    if ((ts._4_4_ == CURLE_OK) && ((*p_Stack_28 & 1U) != 0)) {
      *p_Stack_28 = false;
      if (local_38 == (h1_tunnel_state_conflict *)0x0) {
        CVar1 = tunnel_init((Curl_cfilter *)data_local,(Curl_easy *)done_local,&local_38);
        if (CVar1 != CURLE_OK) {
          return CVar1;
        }
        *(h1_tunnel_state_conflict **)&data_local->mid = local_38;
      }
      ts._4_4_ = 0;
      ts._4_4_ = H1_CONNECT((Curl_cfilter *)data_local,(Curl_easy *)done_local,local_38);
      if (ts._4_4_ == CURLE_OK) {
        (*Curl_cfree)(*(void **)(done_local + 0x13a0));
        done_local[0x13a0] = false;
        done_local[0x13a1] = false;
        done_local[0x13a2] = false;
        done_local[0x13a3] = false;
        done_local[0x13a4] = false;
        done_local[0x13a5] = false;
        done_local[0x13a6] = false;
        done_local[0x13a7] = false;
      }
      local_39 = false;
      if (ts._4_4_ == CURLE_OK) {
        local_39 = tunnel_is_established(*(h1_tunnel_state_conflict **)&data_local->mid);
      }
      *p_Stack_28 = local_39;
      if ((*p_Stack_28 & 1U) != 0) {
        *(byte *)((long)&data_local->conn + 4) = *(byte *)((long)&data_local->conn + 4) & 0xfe | 1;
        Curl_req_soft_reset((SingleRequest *)(done_local + 0xb8),(Curl_easy *)done_local);
        Curl_client_reset((Curl_easy *)done_local);
        Curl_pgrsSetUploadCounter((Curl_easy *)done_local,0);
        Curl_pgrsSetDownloadCounter((Curl_easy *)done_local,0);
        tunnel_free((Curl_cfilter *)data_local,(Curl_easy *)done_local);
      }
      cf_local._4_4_ = ts._4_4_;
    }
  }
  else {
    *done = true;
    cf_local._4_4_ = CURLE_OK;
  }
  return cf_local._4_4_;
}

Assistant:

static CURLcode cf_h1_proxy_connect(struct Curl_cfilter *cf,
                                    struct Curl_easy *data,
                                    bool *done)
{
  CURLcode result;
  struct h1_tunnel_state *ts = cf->ctx;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  CURL_TRC_CF(data, cf, "connect");
  result = cf->next->cft->do_connect(cf->next, data, done);
  if(result || !*done)
    return result;

  *done = FALSE;
  if(!ts) {
    result = tunnel_init(cf, data, &ts);
    if(result)
      return result;
    cf->ctx = ts;
  }

  /* We want "seamless" operations through HTTP proxy tunnel */

  result = H1_CONNECT(cf, data, ts);
  if(result)
    goto out;
  Curl_safefree(data->state.aptr.proxyuserpwd);

out:
  *done = (result == CURLE_OK) && tunnel_is_established(cf->ctx);
  if(*done) {
    cf->connected = TRUE;
    /* The real request will follow the CONNECT, reset request partially */
    Curl_req_soft_reset(&data->req, data);
    Curl_client_reset(data);
    Curl_pgrsSetUploadCounter(data, 0);
    Curl_pgrsSetDownloadCounter(data, 0);

    tunnel_free(cf, data);
  }
  return result;
}